

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.c
# Opt level: O2

void solver_debug_check_clauses(solver_t *s)

{
  clause_conflict *clause;
  uint uVar1;
  uint uVar2;
  uint idx;
  ulong uVar3;
  
  idx = 0;
  fprintf(_stdout,"[Satoko] Checking clauses (%d)...\n",(ulong)s->originals->size);
  while( true ) {
    if (s->originals->size <= idx) {
      fwrite("[Satoko] All SAT - OK\n",0x16,1,_stdout);
      return;
    }
    uVar1 = vec_uint_at(s->originals,idx);
    clause = (clause_conflict *)(s->all_clauses->data + uVar1);
    uVar1 = clause->size;
    uVar3 = 0;
    while( true ) {
      if (uVar1 == uVar3) goto LAB_0072cd9a;
      uVar2 = vec_uint_find(s->trail,*(uint *)(&clause[1].field_0x0 + uVar3 * 4) ^ 1);
      if (uVar2 == 0) break;
      uVar3 = uVar3 + 1;
    }
    if (uVar1 == (uint)uVar3) break;
    idx = idx + 1;
  }
LAB_0072cd9a:
  vec_uint_print(s->trail);
  fprintf(_stdout,"[Satoko] FOUND UNSAT CLAUSE]: (%d) ",(ulong)idx);
  clause_print(clause);
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/solver.c"
                ,0x2e7,"void solver_debug_check_clauses(solver_t *)");
}

Assistant:

void solver_debug_check_clauses(solver_t *s)
{
    unsigned cref, i;

    fprintf(stdout, "[Satoko] Checking clauses (%d)...\n", vec_uint_size(s->originals));
    vec_uint_foreach(s->originals, cref, i) {
        unsigned j;
        struct clause *clause = clause_fetch(s, cref);
        for (j = 0; j < clause->size; j++) {
            if (vec_uint_find(s->trail, lit_compl(clause->data[j].lit))) {
                continue;
            }
            break;
        }
        if (j == clause->size) {
            vec_uint_print(s->trail);
            fprintf(stdout, "[Satoko] FOUND UNSAT CLAUSE]: (%d) ", i);
            clause_print(clause);
            assert(0);
        }
    }
    fprintf(stdout, "[Satoko] All SAT - OK\n");
}